

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O1

void __thiscall vkb::Result<vkb::Device>::destroy(Result<vkb::Device> *this)

{
  pointer pVVar1;
  void *pvVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  if (this->m_init == true) {
    pVVar1 = (this->field_0).m_value.queue_families.
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pVVar1 != (pointer)0x0) {
      operator_delete(pVVar1,(long)(this->field_0).m_value.queue_families.
                                   super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1
                     );
    }
    pvVar2 = *(void **)((long)&this->field_0 + 0x6a8);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)*(pointer *)
                                    ((long)&(this->field_0).m_value.physical_device.
                                            extended_features_chain.nodes.
                                            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                                            ._M_impl.super__Vector_impl_data + 0x10) - (long)pvVar2)
      ;
    }
    pvVar2 = *(void **)((long)&this->field_0 + 0x690);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)(this->field_0).m_value.physical_device.queue_families.
                                   super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2
                     );
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this->field_0).m_value.physical_device.available_extensions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this->field_0).m_value.physical_device.extensions_to_enable);
    pcVar3 = (this->field_0).m_value.physical_device.name._M_dataplus._M_p;
    paVar4 = &(this->field_0).m_value.physical_device.name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar4) {
      operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
      return;
    }
  }
  return;
}

Assistant:

void destroy() {
        if (m_init) m_value.~T();
    }